

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitDecPOMDPDiscrete.cpp
# Opt level: O1

void PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile
               (string *filename,DecPOMDPDiscreteInterface *decpomdp)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  undefined8 *puVar9;
  Index a;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  bool bVar13;
  double dVar14;
  stringstream ss;
  ofstream fp;
  ulong local_408;
  ulong local_3f8;
  ulong local_3e8;
  long local_3d8;
  long local_3d0;
  long *local_3b8;
  long local_3b0;
  long local_3a8 [47];
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  uVar2 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0x40)) + 0x10
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0x40));
  uVar3 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) + 0x30
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  std::ofstream::ofstream(&local_230,(filename->_M_dataplus)._M_p,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_3b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a8,
               "PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile: failed to open file ",0x46);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a8,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar9 = &PTR__E_0059bd80;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_3d8,local_3d0 + local_3d8);
    __cxa_throw(puVar9,&E::typeinfo,E::~E);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"agents: ",8);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"discount: ",10);
  dVar14 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb0)) + 0x70))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0));
  poVar4 = std::ostream::_M_insert<double>(dVar14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  iVar1 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0)) + 0x80
                      ))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb0));
  if (iVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"values: cost",0xc);
  }
  else {
    if (iVar1 != 0) goto LAB_0041110f;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"values: reward",0xe);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)local_228 + -8);
  std::ostream::flush();
LAB_0041110f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"states:",7);
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
      plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                             *(long *)(*(long *)decpomdp + -0xb8)) + 0x38))
                                 (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar7)
      ;
      (**(code **)(*plVar5 + 0x18))(&local_3b8,plVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,(char *)local_3b8,local_3b0);
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8,local_3a8[0] + 1);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < uVar3);
  }
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                         *(long *)(*(long *)decpomdp + -0xb8)) + 0x50))
                             (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"start:",6);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      if ((int)uVar7 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
      }
      dVar14 = (double)(**(code **)(*plVar5 + 0x10))(plVar5,uVar7);
      std::ostream::_M_insert<double>(dVar14);
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < uVar3);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"actions:",8);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  cVar11 = (char)(ostream *)&local_230;
  std::ostream::put(cVar11);
  std::ostream::flush();
  if (uVar2 != 0) {
    uVar7 = 0;
    do {
      uVar10 = 0;
      while( true ) {
        uVar6 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8))
                            + 0x60))
                          (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar7);
        if (uVar6 <= uVar10) break;
        if ((int)uVar10 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
        }
        plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                               *(long *)(*(long *)decpomdp + -0xb8)) + 0x78))
                                   (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                    uVar7,uVar10);
        (**(code **)(*plVar5 + 0x18))(&local_3b8,plVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,(char *)local_3b8,local_3b0);
        if (local_3b8 != local_3a8) {
          operator_delete(local_3b8,local_3a8[0] + 1);
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar11);
      std::ostream::put(cVar11);
      std::ostream::flush();
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar2 != uVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"observations:",0xd);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  cVar11 = (char)(ostream *)&local_230;
  std::ostream::put(cVar11);
  std::ostream::flush();
  if (uVar2 != 0) {
    uVar7 = 0;
    do {
      uVar10 = 0;
      while( true ) {
        uVar6 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8))
                            + 0xc0))
                          (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),uVar7);
        if (uVar6 <= uVar10) break;
        if ((int)uVar10 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
        }
        plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                               *(long *)(*(long *)decpomdp + -0xb8)) + 0xd0))
                                   (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                    uVar7,uVar10);
        (**(code **)(*plVar5 + 0x18))(&local_3b8,plVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,(char *)local_3b8,local_3b0);
        if (local_3b8 != local_3a8) {
          operator_delete(local_3b8,local_3a8[0] + 1);
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar11);
      std::ostream::put(cVar11);
      std::ostream::flush();
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar2 != uVar7);
  }
  local_3f8 = 0;
  do {
    uVar7 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)) +
                        0x68))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
    if (uVar7 <= local_3f8) {
      local_3e8 = 0;
      do {
        uVar7 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8))
                            + 0x68))(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
        if (uVar7 <= local_3e8) {
          local_408 = 0;
          do {
            uVar7 = (**(code **)(*(long *)(&decpomdp->field_0x0 +
                                          *(long *)(*(long *)decpomdp + -0xb8)) + 0x68))
                              (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
            if (uVar7 <= local_408) {
              local_230 = _VTT;
              *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_insert<void_const*>;
              std::filebuf::~filebuf(local_228);
              std::ios_base::~ios_base(local_138);
              return;
            }
            if (uVar3 != 0) {
              uVar7 = 0;
              do {
                dVar14 = (double)(**(code **)(*(long *)decpomdp + 0xc0))(decpomdp,uVar7,local_408);
                if ((dVar14 != 0.0) || (NAN(dVar14))) {
                  plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                                         *(long *)(*(long *)decpomdp + -0xb8)) +
                                               0x98))(&decpomdp->field_0x0 +
                                                      *(long *)(*(long *)decpomdp + -0xb8),local_408
                                                     );
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"R:",2);
                  if (uVar2 != 0) {
                    uVar10 = 0;
                    uVar6 = 1;
                    do {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_230," ",1);
                      if ((ulong)(plVar5[1] - *plVar5 >> 2) <= uVar10) {
                        std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar10);
                      }
                      std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
                      bVar13 = uVar2 != uVar6;
                      uVar10 = uVar6;
                      uVar6 = (ulong)((int)uVar6 + 1);
                    } while (bVar13);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," : ",3);
                  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : * : * : ",0xb);
                  poVar4 = std::ostream::_M_insert<double>(dVar14);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                  std::ostream::put((char)poVar4);
                  std::ostream::flush();
                }
                uVar7 = (ulong)((int)uVar7 + 1);
              } while (uVar7 < uVar3);
            }
            local_408 = (ulong)((int)local_408 + 1);
          } while( true );
        }
        local_3f8 = 0;
        while( true ) {
          uVar7 = (**(code **)(*(long *)(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8)
                                        ) + 200))
                            (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8));
          if (uVar7 <= local_3f8) break;
          if (uVar3 != 0) {
            uVar7 = 0;
            do {
              dVar14 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                                     *(long *)(*(long *)decpomdp + -0xb8)) + 0x118))
                                         (&decpomdp->field_0x0 +
                                          *(long *)(*(long *)decpomdp + -0xb8),local_3e8,uVar7,
                                          local_3f8);
              if ((dVar14 != 0.0) || (NAN(dVar14))) {
                plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                                       *(long *)(*(long *)decpomdp + -0xb8)) + 0x98)
                                 )(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                   local_3e8);
                plVar8 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                                       *(long *)(*(long *)decpomdp + -0xb8)) + 0xe8)
                                 )(&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                   local_3f8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"O:",2);
                if (uVar2 != 0) {
                  uVar12 = 1;
                  uVar10 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
                    if ((ulong)(plVar5[1] - *plVar5 >> 2) <= uVar10) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar10);
                    }
                    std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
                    uVar10 = (ulong)uVar12;
                    uVar12 = uVar12 + 1;
                  } while (uVar2 != uVar10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," : ",3);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," :",2);
                if (uVar2 != 0) {
                  uVar10 = 0;
                  uVar6 = 1;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
                    if ((ulong)(plVar8[1] - *plVar8 >> 2) <= uVar10) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar10);
                    }
                    std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
                    bVar13 = uVar2 != uVar6;
                    uVar10 = uVar6;
                    uVar6 = (ulong)((int)uVar6 + 1);
                  } while (bVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," : ",3);
                poVar4 = std::ostream::_M_insert<double>(dVar14);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
              }
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (uVar7 < uVar3);
          }
          local_3f8 = (ulong)((int)local_3f8 + 1);
        }
        local_3e8 = (ulong)((int)local_3e8 + 1);
      } while( true );
    }
    if (uVar3 != 0) {
      local_408 = 0;
      do {
        uVar7 = 0;
        do {
          dVar14 = (double)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                                 *(long *)(*(long *)decpomdp + -0xb8)) + 0x108))
                                     (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                      local_408,local_3f8,uVar7);
          if ((dVar14 != 0.0) || (NAN(dVar14))) {
            plVar5 = (long *)(**(code **)(*(long *)(&decpomdp->field_0x0 +
                                                   *(long *)(*(long *)decpomdp + -0xb8)) + 0x98))
                                       (&decpomdp->field_0x0 + *(long *)(*(long *)decpomdp + -0xb8),
                                        local_3f8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"T:",2);
            if (uVar2 != 0) {
              uVar10 = 0;
              uVar6 = 1;
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
                if ((ulong)(plVar5[1] - *plVar5 >> 2) <= uVar10) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar10);
                }
                std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
                bVar13 = uVar2 != uVar6;
                uVar10 = uVar6;
                uVar6 = (ulong)((int)uVar6 + 1);
              } while (bVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," : ",3);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
            poVar4 = std::ostream::_M_insert<double>(dVar14);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar7 < uVar3);
        local_408 = (ulong)((int)local_408 + 1);
      } while (local_408 < uVar3);
    }
    local_3f8 = (ulong)((int)local_3f8 + 1);
  } while( true );
}

Assistant:

void PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile(
    const string & filename,
    const DecPOMDPDiscreteInterface *decpomdp)
{
    size_t nrAg=decpomdp->GetNrAgents(),
        nrS=decpomdp->GetNrStates();
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "PlanningUnitDecPOMDPDiscrete::ExportDecPOMDPFile: failed to open file "
           << filename;
        throw(E(ss.str()));
    }

    fp << "agents: " << nrAg << endl;
    fp << "discount: " << decpomdp->GetDiscount() << endl;
    switch(decpomdp->GetRewardType())
    {
    case REWARD:
        fp << "values: reward" << endl;
        break;
    case COST:
        fp << "values: cost" << endl;
    }

    fp << "states:";
    for(Index s=0;s<nrS;s++)
        fp << " "  << decpomdp->GetState(s)->SoftPrintBrief();
    fp << endl;

    StateDistribution* isd = decpomdp->GetISD();
    fp << "start:" << endl;
    for(Index s0=0;s0<nrS;s0++)
    {
        if(s0>0)
            fp << " ";
        double bs = isd->GetProbability(s0);
        fp <<  bs;
    }
    fp << endl;

    fp << "actions:" << endl;
    for(Index i=0;i!=nrAg;++i)
    {
        for(Index a=0;a<decpomdp->GetNrActions(i);a++)
        {
            if(a>0)
                fp << " ";
            fp << decpomdp->GetAction(i,a)->SoftPrintBrief();
        }
        fp << endl;
    }

    fp << "observations:" << endl;
    for(Index i=0;i!=nrAg;++i)
    {
        for(Index o=0;o<decpomdp->GetNrObservations(i);o++)
        {
            if(o>0)
                fp << " ";
            fp << decpomdp->GetObservation(i,o)->SoftPrintBrief();
        }
        fp << endl;
    }

    double p;
    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index s0=0;s0<nrS;s0++)
            for(Index s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetTransitionProbability(s0,a,s1);
                if(p!=0)
                {
                    const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                    fp << "T:";
                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << aIs.at(i);
                    fp << " : " << s0 << " : " << s1 << " : " 
                       << p << endl;
                }
            }

    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index o=0;o<decpomdp->GetNrJointObservations();o++)
            for(Index s1=0;s1<nrS;s1++)
            {
                p=decpomdp->GetObservationProbability(a,s1,o);
                if(p!=0)
                {
                    const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                    const vector<Index> &oIs=decpomdp->JointToIndividualObservationIndices(o);
                    fp << "O:";

                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << aIs.at(i);

                    fp << " : " << s1 << " :";

                    for(Index i=0;i!=nrAg;++i)
                        fp << " " << oIs.at(i);
                    fp << " : " << p << endl;
                }
            }

    for(Index a=0;a<decpomdp->GetNrJointActions();a++)
        for(Index s0=0;s0<nrS;s0++)
        {
            p=decpomdp->GetReward(s0,a);
            if(p!=0)
            {
                const vector<Index> &aIs=decpomdp->JointToIndividualActionIndices(a);
                fp << "R:";

                for(Index i=0;i!=nrAg;++i)
                    fp << " " << aIs.at(i);
                fp << " : " << s0 << " : * : * : " << p << endl;
            }
        }
}